

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O1

int mbedtls_camellia_setkey_enc(mbedtls_camellia_context *ctx,uchar *key,uint keybits)

{
  uint32_t *__s;
  uint32_t *x;
  uint32_t *z;
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  byte bVar7;
  long lVar8;
  uchar *puVar9;
  uint *puVar10;
  uint32_t KC [16];
  uint32_t TK [20];
  uint32_t SIGMA [6] [2];
  uchar t [64];
  uint auStack_168 [4];
  uint local_158 [4];
  uint local_148 [18];
  undefined8 local_100;
  uint local_f8 [20];
  uint32_t local_a8 [12];
  uint local_78 [4];
  byte local_68 [56];
  ulong uVar6;
  
  __s = ctx->rk;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  local_68[8] = 0;
  local_68[9] = 0;
  local_68[10] = 0;
  local_68[0xb] = 0;
  local_68[0xc] = 0;
  local_68[0xd] = 0;
  local_68[0xe] = 0;
  local_68[0xf] = 0;
  local_68[0x10] = 0;
  local_68[0x11] = 0;
  local_68[0x12] = 0;
  local_68[0x13] = 0;
  local_68[0x14] = 0;
  local_68[0x15] = 0;
  local_68[0x16] = 0;
  local_68[0x17] = 0;
  local_68[0x18] = 0;
  local_68[0x19] = 0;
  local_68[0x1a] = 0;
  local_68[0x1b] = 0;
  local_68[0x1c] = 0;
  local_68[0x1d] = 0;
  local_68[0x1e] = 0;
  local_68[0x1f] = 0;
  local_68[0x20] = 0;
  local_68[0x21] = 0;
  local_68[0x22] = 0;
  local_68[0x23] = 0;
  local_68[0x24] = 0;
  local_68[0x25] = 0;
  local_68[0x26] = 0;
  local_68[0x27] = 0;
  local_68[0x28] = 0;
  local_68[0x29] = 0;
  local_68[0x2a] = 0;
  local_68[0x2b] = 0;
  local_68[0x2c] = 0;
  local_68[0x2d] = 0;
  local_68[0x2e] = 0;
  local_68[0x2f] = 0;
  local_100 = ctx;
  memset(__s,0,0x110);
  if (keybits == 0x80) {
    local_158[0] = 0;
    local_158[1] = 0;
    iVar4 = 3;
  }
  else {
    if ((keybits != 0x100) && (keybits != 0xc0)) {
      return -0x24;
    }
    local_158[0] = 1;
    local_158[1] = 0;
    iVar4 = 4;
  }
  local_100->nr = iVar4;
  auStack_168[3] = keybits;
  if (7 < keybits) {
    memcpy(local_78,key,(ulong)(keybits >> 3));
  }
  if (auStack_168[3] == 0xc0) {
    lVar5 = -8;
    do {
      local_68[lVar5 + 0x10] = ~local_68[lVar5 + 8];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0);
  }
  lVar5 = 0;
  do {
    uVar1 = *(uint *)SIGMA_CHARS[lVar5];
    uVar2 = *(uint *)(SIGMA_CHARS[lVar5] + 4);
    local_a8[lVar5 * 2] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    local_a8[lVar5 * 2 + 1] =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  local_148[0xc] = 0;
  local_148[0xd] = 0;
  local_148[0xe] = 0;
  local_148[0xf] = 0;
  local_148[8] = 0;
  local_148[9] = 0;
  local_148[10] = 0;
  local_148[0xb] = 0;
  local_148[4] = 0;
  local_148[5] = 0;
  local_148[6] = 0;
  local_148[7] = 0;
  local_148[0] = 0;
  local_148[1] = 0;
  local_148[2] = 0;
  local_148[3] = 0;
  lVar5 = 0;
  do {
    uVar1 = local_78[lVar5];
    local_148[lVar5] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  lVar5 = 8;
  do {
    local_148[lVar5] = local_158[lVar5] ^ auStack_168[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xc);
  x = local_148 + 8;
  z = local_148 + 10;
  camellia_feistel(x,local_a8,z);
  camellia_feistel(z,local_a8 + 2,x);
  lVar5 = 8;
  do {
    local_148[lVar5] = local_148[lVar5] ^ auStack_168[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xc);
  camellia_feistel(x,local_a8 + 4,z);
  camellia_feistel(z,local_a8 + 6,x);
  if (0x80 < auStack_168[3]) {
    lVar5 = -0x10;
    do {
      *(uint *)((long)local_148 + lVar5 + 0x40) =
           *(uint *)((long)local_148 + lVar5 + 0x30) ^ *(uint *)((long)local_148 + lVar5 + 0x20);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0);
    camellia_feistel(local_148 + 0xc,local_a8 + 8,local_148 + 0xe);
    camellia_feistel(local_148 + 0xe,local_a8 + 10,local_148 + 0xc);
  }
  local_f8[0] = local_148[0];
  local_f8[1] = local_148[1];
  local_f8[2] = local_148[2];
  local_f8[3] = local_148[3];
  iVar4 = (int)local_158._0_8_;
  uVar6 = (ulong)(uint)(iVar4 << 4);
  puVar9 = shifts[0][0] + uVar6;
  lVar5 = 0x1c;
  bVar3 = 0xf;
  do {
    if (*puVar9 != '\0') {
      bVar7 = -(bVar3 & 0x1f);
      *(uint *)((long)local_148 + lVar5 + 0x44) =
           local_148[1] >> (bVar7 & 0x1f) ^ local_148[0] << (bVar3 & 0x1f);
      *(uint *)((long)local_f8 + lVar5 + -8) =
           local_148[2] >> (bVar7 & 0x1f) ^ local_148[1] << (bVar3 & 0x1f);
      *(uint *)((long)local_f8 + lVar5 + -4) =
           local_148[3] >> (bVar7 & 0x1f) ^ local_148[2] << (bVar3 & 0x1f);
      *(uint *)((long)local_f8 + lVar5) =
           local_148[0] >> (bVar7 & 0x1f) ^ local_148[3] << (bVar3 & 0x1f);
    }
    lVar5 = lVar5 + 0x10;
    puVar9 = puVar9 + 1;
    bVar3 = bVar3 + 0xf;
  } while (lVar5 != 0x5c);
  lVar5 = 0;
  do {
    lVar8 = (long)indexes[0][0][lVar5 + (ulong)(uint)(iVar4 * 0x50)];
    if (lVar8 != -1) {
      __s[lVar8] = local_f8[lVar5];
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x14);
  if (0x80 < auStack_168[3]) {
    puVar10 = local_f8 + 7;
    local_f8[0] = local_148[4];
    local_f8[1] = local_148[5];
    local_f8[2] = local_148[6];
    local_f8[3] = local_148[7];
    bVar3 = 0xf;
    lVar5 = 0;
    do {
      if (*(char *)(uVar6 + 0x186eb4 + lVar5) != '\0') {
        bVar7 = -(bVar3 & 0x1f);
        puVar10[-3] = local_148[5] >> (bVar7 & 0x1f) ^ local_148[4] << (bVar3 & 0x1f);
        puVar10[-2] = local_148[6] >> (bVar7 & 0x1f) ^ local_148[5] << (bVar3 & 0x1f);
        puVar10[-1] = local_148[7] >> (bVar7 & 0x1f) ^ local_148[6] << (bVar3 & 0x1f);
        *puVar10 = local_148[4] >> (bVar7 & 0x1f) ^ local_148[7] << (bVar3 & 0x1f);
      }
      lVar5 = lVar5 + 1;
      puVar10 = puVar10 + 4;
      bVar3 = bVar3 + 0xf;
    } while (lVar5 != 4);
    lVar5 = 0;
    do {
      lVar8 = (long)*(char *)((ulong)(uint)(iVar4 * 0x50) + 0x186624 + lVar5);
      if (lVar8 != -1) {
        __s[lVar8] = local_f8[lVar5];
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x14);
  }
  local_f8[0] = local_148[8];
  local_f8[1] = local_148[9];
  local_f8[2] = local_148[10];
  local_f8[3] = local_148[0xb];
  puVar9 = shifts[0][2] + uVar6;
  lVar5 = 0x1c;
  bVar3 = 0xf;
  do {
    if (*puVar9 != '\0') {
      bVar7 = -(bVar3 & 0x1f);
      *(uint *)((long)local_148 + lVar5 + 0x44) =
           local_148[9] >> (bVar7 & 0x1f) ^ local_148[8] << (bVar3 & 0x1f);
      *(uint *)((long)local_f8 + lVar5 + -8) =
           local_148[10] >> (bVar7 & 0x1f) ^ local_148[9] << (bVar3 & 0x1f);
      *(uint *)((long)local_f8 + lVar5 + -4) =
           local_148[0xb] >> (bVar7 & 0x1f) ^ local_148[10] << (bVar3 & 0x1f);
      *(uint *)((long)local_f8 + lVar5) =
           local_148[8] >> (bVar7 & 0x1f) ^ local_148[0xb] << (bVar3 & 0x1f);
    }
    lVar5 = lVar5 + 0x10;
    puVar9 = puVar9 + 1;
    bVar3 = bVar3 + 0xf;
  } while (lVar5 != 0x5c);
  lVar5 = 0;
  do {
    lVar8 = (long)*(char *)((ulong)(uint)(iVar4 * 0x50) + 0x186638 + lVar5);
    if (lVar8 != -1) {
      __s[lVar8] = local_f8[lVar5];
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x14);
  if (0x80 < auStack_168[3]) {
    puVar10 = local_f8 + 7;
    local_f8[0] = local_148[0xc];
    local_f8[1] = local_148[0xd];
    local_f8[2] = local_148[0xe];
    local_f8[3] = local_148[0xf];
    bVar3 = 0xf;
    lVar5 = 0;
    do {
      if (*(char *)(uVar6 + 0x186ebc + lVar5) != '\0') {
        bVar7 = -(bVar3 & 0x1f);
        puVar10[-3] = local_148[0xd] >> (bVar7 & 0x1f) ^ local_148[0xc] << (bVar3 & 0x1f);
        puVar10[-2] = local_148[0xe] >> (bVar7 & 0x1f) ^ local_148[0xd] << (bVar3 & 0x1f);
        puVar10[-1] = local_148[0xf] >> (bVar7 & 0x1f) ^ local_148[0xe] << (bVar3 & 0x1f);
        *puVar10 = local_148[0xc] >> (bVar7 & 0x1f) ^ local_148[0xf] << (bVar3 & 0x1f);
      }
      lVar5 = lVar5 + 1;
      puVar10 = puVar10 + 4;
      bVar3 = bVar3 + 0xf;
    } while (lVar5 != 4);
    lVar5 = 0;
    do {
      lVar8 = (long)*(char *)((ulong)(uint)(iVar4 * 0x50) + 0x18664c + lVar5);
      if (lVar8 != -1) {
        __s[lVar8] = local_f8[lVar5];
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x14);
  }
  lVar5 = 0;
  do {
    if ((long)transposes[0][(ulong)(uint)(iVar4 << 2) * 5 + lVar5] != -1) {
      *(uint32_t *)((long)local_100->rk + lVar5 * 4 + (ulong)(uint)(iVar4 * 0x30) + 0x80) =
           __s[transposes[0][(ulong)(uint)(iVar4 << 2) * 5 + lVar5]];
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x14);
  return 0;
}

Assistant:

int mbedtls_camellia_setkey_enc( mbedtls_camellia_context *ctx, const unsigned char *key,
                         unsigned int keybits )
{
    int idx;
    size_t i;
    uint32_t *RK;
    unsigned char t[64];
    uint32_t SIGMA[6][2];
    uint32_t KC[16];
    uint32_t TK[20];

    RK = ctx->rk;

    memset( t, 0, 64 );
    memset( RK, 0, sizeof(ctx->rk) );

    switch( keybits )
    {
        case 128: ctx->nr = 3; idx = 0; break;
        case 192:
        case 256: ctx->nr = 4; idx = 1; break;
        default : return( MBEDTLS_ERR_CAMELLIA_INVALID_KEY_LENGTH );
    }

    for( i = 0; i < keybits / 8; ++i )
        t[i] = key[i];

    if( keybits == 192 ) {
        for( i = 0; i < 8; i++ )
            t[24 + i] = ~t[16 + i];
    }

    /*
     * Prepare SIGMA values
     */
    for( i = 0; i < 6; i++ ) {
        GET_UINT32_BE( SIGMA[i][0], SIGMA_CHARS[i], 0 );
        GET_UINT32_BE( SIGMA[i][1], SIGMA_CHARS[i], 4 );
    }

    /*
     * Key storage in KC
     * Order: KL, KR, KA, KB
     */
    memset( KC, 0, sizeof(KC) );

    /* Store KL, KR */
    for( i = 0; i < 8; i++ )
        GET_UINT32_BE( KC[i], t, i * 4 );

    /* Generate KA */
    for( i = 0; i < 4; ++i )
        KC[8 + i] = KC[i] ^ KC[4 + i];

    camellia_feistel( KC + 8, SIGMA[0], KC + 10 );
    camellia_feistel( KC + 10, SIGMA[1], KC + 8 );

    for( i = 0; i < 4; ++i )
        KC[8 + i] ^= KC[i];

    camellia_feistel( KC + 8, SIGMA[2], KC + 10 );
    camellia_feistel( KC + 10, SIGMA[3], KC + 8 );

    if( keybits > 128 ) {
        /* Generate KB */
        for( i = 0; i < 4; ++i )
            KC[12 + i] = KC[4 + i] ^ KC[8 + i];

        camellia_feistel( KC + 12, SIGMA[4], KC + 14 );
        camellia_feistel( KC + 14, SIGMA[5], KC + 12 );
    }

    /*
     * Generating subkeys
     */

    /* Manipulating KL */
    SHIFT_AND_PLACE( idx, 0 );

    /* Manipulating KR */
    if( keybits > 128 ) {
        SHIFT_AND_PLACE( idx, 1 );
    }

    /* Manipulating KA */
    SHIFT_AND_PLACE( idx, 2 );

    /* Manipulating KB */
    if( keybits > 128 ) {
        SHIFT_AND_PLACE( idx, 3 );
    }

    /* Do transpositions */
    for( i = 0; i < 20; i++ ) {
        if( transposes[idx][i] != -1 ) {
            RK[32 + 12 * idx + i] = RK[transposes[idx][i]];
        }
    }

    return( 0 );
}